

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix3f> *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  matrix3f v;
  optional<tinyusdz::value::matrix3f> *value_local;
  AsciiParser *this_local;
  
  unique0x1000007d = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::matrix3f>::operator=(stack0xffffffffffffffe0);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::matrix3f::matrix3f((matrix3f *)local_48);
    bVar1 = ReadBasicType(this,(matrix3f *)local_48);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix3f>::operator=
                (stack0xffffffffffffffe0,(matrix3f *)local_48);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix3f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix3f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}